

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covBuild.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkCovDerive(Cov_Man_t *p,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
    pVVar2 = pNtk->vCos;
    if (0 < pVVar2->nSize) {
      lVar3 = 0;
      do {
        Abc_NtkCovDeriveNode_rec
                  (p,pNtkNew,
                   *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*pVVar2->pArray[lVar3] + 0x20) + 8) +
                    (long)**(int **)((long)pVVar2->pArray[lVar3] + 0x20) * 8),0);
        lVar3 = lVar3 + 1;
        pVVar2 = pNtk->vCos;
      } while (lVar3 < pVVar2->nSize);
    }
    Abc_NtkFinalize(pNtk,pNtkNew);
    Abc_NtkLogicMakeSimpleCos(pNtkNew,1);
    iVar1 = Abc_NtkCheck(pNtkNew);
    if (iVar1 == 0) {
      puts("Abc_NtkCovDerive: The network check has failed.");
      Abc_NtkDelete(pNtkNew);
      pNtkNew = (Abc_Ntk_t *)0x0;
    }
    return pNtkNew;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/cov/covBuild.c"
                ,0xbc,"Abc_Ntk_t *Abc_NtkCovDerive(Cov_Man_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkCovDerive( Cov_Man_t * p, Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // reconstruct the network
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Abc_NtkCovDeriveNode_rec( p, pNtkNew, Abc_ObjFanin0(pObj), 0 );
//        printf( "*** CO %s : %d -> %d \n", Abc_ObjName(pObj), pObj->pCopy->Id, Abc_ObjFanin0(pObj)->pCopy->Id );
    }
    // add the COs
    Abc_NtkFinalize( pNtk, pNtkNew );
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 1 );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCovDerive: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}